

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void write_noise_period(Emulator *e)

{
  u8 divisor;
  Emulator *e_local;
  
  if ((e->state).apu.noise.divisor < 8) {
    (e->state).apu.noise.period =
         (uint)"\b\x10 0@P`p"[(e->state).apu.noise.divisor] <<
         ((e->state).apu.noise.clock_shift & 0x1f);
    return;
  }
  __assert_fail("NOISE.divisor < NOISE_DIVISOR_COUNT",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                0xbe4,"void write_noise_period(Emulator *)");
}

Assistant:

static void write_noise_period(Emulator* e) {
  static const u8 s_divisors[NOISE_DIVISOR_COUNT] = {8,  16, 32, 48,
                                                     64, 80, 96, 112};
  u8 divisor = s_divisors[NOISE.divisor];
  assert(NOISE.divisor < NOISE_DIVISOR_COUNT);
  NOISE.period = divisor << NOISE.clock_shift;
  HOOK(write_noise_period_info_iii, divisor, NOISE.clock_shift, NOISE.period);
}